

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_int xmrig::OclLib::enqueueReadBuffer
                 (cl_command_queue command_queue,cl_mem buffer,cl_bool blocking_read,size_t offset,
                 size_t size,void *ptr,cl_uint num_events_in_wait_list,cl_event *event_wait_list,
                 cl_event *event)

{
  char *fmt;
  cl_int ret_00;
  char *pcVar1;
  size_t in_RCX;
  cl_bool in_EDX;
  cl_mem in_RSI;
  cl_command_queue in_RDI;
  size_t in_R8;
  void *in_R9;
  cl_uint in_stack_00000008;
  cl_event *in_stack_00000010;
  cl_event *in_stack_00000018;
  cl_int ret;
  
  ret_00 = (*pEnqueueReadBuffer)
                     (in_RDI,in_RSI,in_EDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010,
                      in_stack_00000018);
  fmt = kErrorTemplate;
  if (ret_00 != 0) {
    pcVar1 = OclError::toString(ret_00);
    Log::print(ERR,fmt,pcVar1,kEnqueueReadBuffer);
  }
  return ret_00;
}

Assistant:

cl_int xmrig::OclLib::enqueueReadBuffer(cl_command_queue command_queue, cl_mem buffer, cl_bool blocking_read, size_t offset, size_t size, void *ptr, cl_uint num_events_in_wait_list, const cl_event *event_wait_list, cl_event *event) noexcept
{
    assert(pEnqueueReadBuffer != nullptr);

    const cl_int ret = pEnqueueReadBuffer(command_queue, buffer, blocking_read, offset, size, ptr, num_events_in_wait_list, event_wait_list, event);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kEnqueueReadBuffer);
    }

    return ret;
}